

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O0

ActionMessage * __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
          (BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  bool bVar1;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *in_RSI;
  ActionMessage *in_RDI;
  unique_lock<std::mutex> pullLock;
  optional<helics::ActionMessage> val;
  type *actval;
  ActionMessage *in_stack_fffffffffffffe28;
  ActionMessage *this_00;
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffffe68;
  
  this_00 = in_RDI;
  try_pop(in_stack_fffffffffffffe68);
  do {
    bVar1 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x4c1b5b);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::optional<helics::ActionMessage>::operator*((optional<helics::ActionMessage> *)0x4c1d23);
      helics::ActionMessage::ActionMessage(this_00,in_stack_fffffffffffffe28);
      break;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)this_00,(mutex_type *)in_stack_fffffffffffffe28);
    bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                      (in_RSI);
    if (bVar1) {
      std::condition_variable::wait
                ((unique_lock *)
                 &in_RSI[5].
                  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                        (in_RSI);
      if (bVar1) {
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this_00);
        try_pop(in_stack_fffffffffffffe68);
        std::optional<helics::ActionMessage>::operator=
                  ((optional<helics::ActionMessage> *)this_00,
                   (optional<helics::ActionMessage> *)in_stack_fffffffffffffe28);
        std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x4c1cc9)
        ;
        bVar1 = false;
      }
      else {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00)
        ;
        helics::ActionMessage::ActionMessage(this_00,in_stack_fffffffffffffe28);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x4c1c64
                  );
        bVar1 = true;
      }
    }
    else {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00);
      helics::ActionMessage::ActionMessage(this_00,in_stack_fffffffffffffe28);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x4c1bc1);
      bVar1 = true;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00);
  } while (!bVar1);
  std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x4c1d48);
  return in_RDI;
}

Assistant:

T pop()
        {
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    auto actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    auto actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            return std::move(*val);
        }